

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O0

mz_bool mz_zip_writer_create_local_dir_header
                  (mz_zip_archive *pZip,mz_uint8 *pDst,mz_uint16 filename_size,mz_uint16 extra_size,
                  mz_uint64 uncomp_size,mz_uint64 comp_size,mz_uint32 uncomp_crc32,mz_uint16 method,
                  mz_uint16 bit_flags,mz_uint16 dos_time,mz_uint16 dos_date)

{
  mz_uint16 v;
  mz_uint16 in_CX;
  mz_uint16 in_DX;
  mz_uint8 *in_RSI;
  mz_uint32 in_R8D;
  mz_uint32 in_R9D;
  mz_uint16 in_stack_00000010;
  mz_uint16 in_stack_00000028;
  
  memset(in_RSI,0,0x1e);
  mz_write_le32(in_RSI,0x4034b50);
  v = 0;
  if (in_stack_00000010 != 0) {
    v = 0x14;
  }
  mz_write_le16(in_RSI + 4,v);
  mz_write_le16(in_RSI + 6,(mz_uint16)pDst);
  mz_write_le16(in_RSI + 8,in_stack_00000010);
  mz_write_le16(in_RSI + 10,(mz_uint16)pZip);
  mz_write_le16(in_RSI + 0xc,in_stack_00000028);
  mz_write_le32(in_RSI + 0xe,(mz_uint32)uncomp_size);
  mz_write_le32(in_RSI + 0x12,in_R9D);
  mz_write_le32(in_RSI + 0x16,in_R8D);
  mz_write_le16(in_RSI + 0x1a,in_DX);
  mz_write_le16(in_RSI + 0x1c,in_CX);
  return 1;
}

Assistant:

static mz_bool mz_zip_writer_create_local_dir_header(mz_zip_archive* pZip, mz_uint8* pDst, mz_uint16 filename_size, mz_uint16 extra_size, mz_uint64 uncomp_size, mz_uint64 comp_size, mz_uint32 uncomp_crc32, mz_uint16 method, mz_uint16 bit_flags, mz_uint16 dos_time, mz_uint16 dos_date) {
  (void)pZip;
  memset(pDst, 0, MZ_ZIP_LOCAL_DIR_HEADER_SIZE);
  MZ_WRITE_LE32(pDst + MZ_ZIP_LDH_SIG_OFS, MZ_ZIP_LOCAL_DIR_HEADER_SIG);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_VERSION_NEEDED_OFS, method ? 20 : 0);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_BIT_FLAG_OFS, bit_flags);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_METHOD_OFS, method);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_FILE_TIME_OFS, dos_time);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_FILE_DATE_OFS, dos_date);
  MZ_WRITE_LE32(pDst + MZ_ZIP_LDH_CRC32_OFS, uncomp_crc32);
  MZ_WRITE_LE32(pDst + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS, comp_size);
  MZ_WRITE_LE32(pDst + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS, uncomp_size);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_FILENAME_LEN_OFS, filename_size);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_EXTRA_LEN_OFS, extra_size);
  return MZ_TRUE;
}